

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetNavFocusScope(ImGuiID focus_scope_id)

{
  int iVar1;
  ImGuiID IVar2;
  ImGuiID IVar3;
  ImGuiFocusScopeData *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiFocusScopeData *pIVar6;
  ImGuiFocusScopeData *__dest;
  uint uVar7;
  int iVar8;
  ImGuiFocusScopeData IVar9;
  int iVar10;
  ulong uVar11;
  ImGuiFocusScopeData IVar12;
  long lVar13;
  ImGuiWindow *pIVar14;
  
  pIVar5 = GImGui;
  GImGui->NavFocusScopeId = focus_scope_id;
  iVar10 = (pIVar5->NavFocusRoute).Capacity;
  if (iVar10 < 0) {
    uVar7 = iVar10 / 2 + iVar10;
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)uVar7;
    }
    pIVar6 = (ImGuiFocusScopeData *)MemAlloc(uVar11 * 8);
    pIVar4 = (pIVar5->NavFocusRoute).Data;
    if (pIVar4 != (ImGuiFocusScopeData *)0x0) {
      memcpy(pIVar6,pIVar4,(long)(pIVar5->NavFocusRoute).Size << 3);
      MemFree((pIVar5->NavFocusRoute).Data);
    }
    (pIVar5->NavFocusRoute).Data = pIVar6;
    (pIVar5->NavFocusRoute).Capacity = (int)uVar11;
  }
  (pIVar5->NavFocusRoute).Size = 0;
  if (focus_scope_id != 0) {
    if (pIVar5->CurrentFocusScopeId == focus_scope_id) {
      lVar13 = (long)(pIVar5->FocusScopeStack).Size;
      if (0 < lVar13) {
        lVar13 = lVar13 + 1;
        do {
          pIVar4 = (pIVar5->FocusScopeStack).Data;
          if (pIVar4[lVar13 + -2].WindowID != pIVar5->CurrentWindow->ID) break;
          iVar10 = (pIVar5->NavFocusRoute).Size;
          iVar1 = (pIVar5->NavFocusRoute).Capacity;
          if (iVar10 == iVar1) {
            if (iVar1 == 0) {
              iVar8 = 8;
            }
            else {
              iVar8 = iVar1 / 2 + iVar1;
            }
            iVar10 = iVar10 + 1;
            if (iVar10 < iVar8) {
              iVar10 = iVar8;
            }
            if (iVar1 < iVar10) {
              __dest = (ImGuiFocusScopeData *)MemAlloc((long)iVar10 << 3);
              pIVar6 = (pIVar5->NavFocusRoute).Data;
              if (pIVar6 != (ImGuiFocusScopeData *)0x0) {
                memcpy(__dest,pIVar6,(long)(pIVar5->NavFocusRoute).Size << 3);
                MemFree((pIVar5->NavFocusRoute).Data);
              }
              (pIVar5->NavFocusRoute).Data = __dest;
              (pIVar5->NavFocusRoute).Capacity = iVar10;
            }
          }
          (pIVar5->NavFocusRoute).Data[(pIVar5->NavFocusRoute).Size] = pIVar4[lVar13 + -2];
          (pIVar5->NavFocusRoute).Size = (pIVar5->NavFocusRoute).Size + 1;
          lVar13 = lVar13 + -1;
        } while (1 < lVar13);
      }
    }
    else {
      if (pIVar5->NavWindow->NavRootFocusScopeId != focus_scope_id) {
        return;
      }
      IVar2 = pIVar5->NavWindow->ID;
      if ((pIVar5->NavFocusRoute).Capacity == 0) {
        pIVar6 = (ImGuiFocusScopeData *)MemAlloc(0x40);
        pIVar4 = (pIVar5->NavFocusRoute).Data;
        if (pIVar4 != (ImGuiFocusScopeData *)0x0) {
          memcpy(pIVar6,pIVar4,(long)(pIVar5->NavFocusRoute).Size << 3);
          MemFree((pIVar5->NavFocusRoute).Data);
        }
        (pIVar5->NavFocusRoute).Data = pIVar6;
        (pIVar5->NavFocusRoute).Capacity = 8;
      }
      IVar9.WindowID = IVar2;
      IVar9.ID = focus_scope_id;
      (pIVar5->NavFocusRoute).Data[(pIVar5->NavFocusRoute).Size] = IVar9;
      (pIVar5->NavFocusRoute).Size = (pIVar5->NavFocusRoute).Size + 1;
    }
    for (pIVar14 = pIVar5->NavWindow->ParentWindowForFocusRoute; pIVar14 != (ImGuiWindow *)0x0;
        pIVar14 = pIVar14->ParentWindowForFocusRoute) {
      IVar2 = pIVar14->NavRootFocusScopeId;
      IVar3 = pIVar14->ID;
      iVar10 = (pIVar5->NavFocusRoute).Size;
      iVar1 = (pIVar5->NavFocusRoute).Capacity;
      if (iVar10 == iVar1) {
        if (iVar1 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar1 / 2 + iVar1;
        }
        iVar10 = iVar10 + 1;
        if (iVar10 < iVar8) {
          iVar10 = iVar8;
        }
        if (iVar1 < iVar10) {
          pIVar6 = (ImGuiFocusScopeData *)MemAlloc((long)iVar10 << 3);
          pIVar4 = (pIVar5->NavFocusRoute).Data;
          if (pIVar4 != (ImGuiFocusScopeData *)0x0) {
            memcpy(pIVar6,pIVar4,(long)(pIVar5->NavFocusRoute).Size << 3);
            MemFree((pIVar5->NavFocusRoute).Data);
          }
          (pIVar5->NavFocusRoute).Data = pIVar6;
          (pIVar5->NavFocusRoute).Capacity = iVar10;
        }
      }
      IVar12.WindowID = IVar3;
      IVar12.ID = IVar2;
      (pIVar5->NavFocusRoute).Data[(pIVar5->NavFocusRoute).Size] = IVar12;
      (pIVar5->NavFocusRoute).Size = (pIVar5->NavFocusRoute).Size + 1;
    }
  }
  return;
}

Assistant:

void ImGui::SetNavFocusScope(ImGuiID focus_scope_id)
{
    ImGuiContext& g = *GImGui;
    g.NavFocusScopeId = focus_scope_id;
    g.NavFocusRoute.resize(0); // Invalidate
    if (focus_scope_id == 0)
        return;
    IM_ASSERT(g.NavWindow != NULL);

    // Store current path (in reverse order)
    if (focus_scope_id == g.CurrentFocusScopeId)
    {
        // Top of focus stack contains local focus scopes inside current window
        for (int n = g.FocusScopeStack.Size - 1; n >= 0 && g.FocusScopeStack.Data[n].WindowID == g.CurrentWindow->ID; n--)
            g.NavFocusRoute.push_back(g.FocusScopeStack.Data[n]);
    }
    else if (focus_scope_id == g.NavWindow->NavRootFocusScopeId)
        g.NavFocusRoute.push_back({ focus_scope_id, g.NavWindow->ID });
    else
        return;

    // Then follow on manually set ParentWindowForFocusRoute field (#6798)
    for (ImGuiWindow* window = g.NavWindow->ParentWindowForFocusRoute; window != NULL; window = window->ParentWindowForFocusRoute)
        g.NavFocusRoute.push_back({ window->NavRootFocusScopeId, window->ID });
    IM_ASSERT(g.NavFocusRoute.Size < 100); // Maximum depth is technically 251 as per CalcRoutingScore(): 254 - 3
}